

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

optional<tinyusdz::Interpolation> *
tinyusdz::InterpolationFromString
          (optional<tinyusdz::Interpolation> *__return_storage_ptr__,string *v)

{
  bool bVar1;
  Interpolation local_2c [5];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *v_local;
  
  local_18 = v;
  v_local = (string *)__return_storage_ptr__;
  bVar1 = std::operator==("faceVarying",v);
  if (bVar1) {
    local_2c[4] = 4;
    nonstd::optional_lite::optional<tinyusdz::Interpolation>::optional<tinyusdz::Interpolation,_0>
              (__return_storage_ptr__,local_2c + 4);
  }
  else {
    bVar1 = std::operator==("constant",local_18);
    if (bVar1) {
      local_2c[3] = 0;
      nonstd::optional_lite::optional<tinyusdz::Interpolation>::optional<tinyusdz::Interpolation,_0>
                (__return_storage_ptr__,local_2c + 3);
    }
    else {
      bVar1 = std::operator==("uniform",local_18);
      if (bVar1) {
        local_2c[2] = 1;
        nonstd::optional_lite::optional<tinyusdz::Interpolation>::
        optional<tinyusdz::Interpolation,_0>(__return_storage_ptr__,local_2c + 2);
      }
      else {
        bVar1 = std::operator==("vertex",local_18);
        if (bVar1) {
          local_2c[1] = 3;
          nonstd::optional_lite::optional<tinyusdz::Interpolation>::
          optional<tinyusdz::Interpolation,_0>(__return_storage_ptr__,local_2c + 1);
        }
        else {
          bVar1 = std::operator==("varying",local_18);
          if (bVar1) {
            local_2c[0] = Varying;
            nonstd::optional_lite::optional<tinyusdz::Interpolation>::
            optional<tinyusdz::Interpolation,_0>(__return_storage_ptr__,local_2c);
          }
          else {
            nonstd::optional_lite::optional<tinyusdz::Interpolation>::optional
                      (__return_storage_ptr__);
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<Interpolation> InterpolationFromString(const std::string &v) {
  if ("faceVarying" == v) {
    return Interpolation::FaceVarying;
  } else if ("constant" == v) {
    return Interpolation::Constant;
  } else if ("uniform" == v) {
    return Interpolation::Uniform;
  } else if ("vertex" == v) {
    return Interpolation::Vertex;
  } else if ("varying" == v) {
    return Interpolation::Varying;
  }
  return nonstd::nullopt;
}